

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_base64_encode(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pObj;
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  char cVar4;
  undefined8 in_RAX;
  char *pcVar5;
  uint uVar6;
  int nLen;
  undefined8 local_38;
  
  if (0 < nArg) {
    local_38 = in_RAX;
    pcVar5 = jx9_value_to_string(*apArg,(int *)((long)&local_38 + 4));
    uVar2 = local_38._4_4_;
    if (0 < (int)local_38._4_4_) {
      uVar6 = 0;
      if (2 < local_38._4_4_) {
        uVar3 = 2;
        do {
          uVar6 = uVar3;
          uVar1 = local_38;
          local_38._0_2_ =
               CONCAT11("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                        [(byte)((byte)pcVar5[uVar6 - 1] >> 4 | pcVar5[uVar6 - 2] << 4) & 0x3f],
                        "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                        [(byte)pcVar5[uVar6 - 2] >> 2]);
          local_38._0_3_ =
               CONCAT12("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                        [(byte)((byte)pcVar5[uVar6] >> 6 | pcVar5[uVar6 - 1] << 2) & 0x3f],
                        (undefined2)local_38);
          local_38._4_4_ = SUB84(uVar1,4);
          local_38._0_4_ =
               CONCAT13("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                        [(byte)pcVar5[uVar6] & 0x3f],(undefined3)local_38);
          jx9_value_string(pCtx->pRet,(char *)&local_38,4);
          uVar3 = uVar6 + 3;
        } while (uVar6 + 3 < uVar2);
        uVar6 = uVar6 + 1;
      }
      uVar1 = local_38;
      if (uVar6 + 1 < uVar2) {
        local_38._0_2_ =
             CONCAT11("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                      [(byte)((byte)pcVar5[uVar6 + 1] >> 4 | pcVar5[uVar6] << 4) & 0x3f],
                      "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                      [(byte)pcVar5[uVar6] >> 2]);
        cVar4 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [(ulong)((byte)pcVar5[uVar6 + 1] & 0xf) * 4];
      }
      else {
        if (uVar2 <= uVar6) {
          return 0;
        }
        local_38._0_2_ =
             CONCAT11("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                      [((byte)pcVar5[uVar6] & 3) << 4],
                      "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                      [(byte)pcVar5[uVar6] >> 2]);
        cVar4 = '=';
      }
      local_38._0_3_ = CONCAT12(cVar4,(undefined2)local_38);
      local_38._4_4_ = SUB84(uVar1,4);
      local_38._0_4_ = CONCAT13(0x3d,(undefined3)local_38);
      jx9_value_string(pCtx->pRet,(char *)&local_38,4);
      return 0;
    }
  }
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  (pObj->x).rVal = 0.0;
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_base64_encode(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zIn;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the input string */
	zIn = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Nothing to process, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the BASE64 encoding */
	SyBase64Encode(zIn, (sxu32)nLen, Consumer, pCtx);
	return JX9_OK;
}